

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

EGLint eglu::getRenderableAPIsMask(Library *egl,EGLDisplay display)

{
  pointer display_00;
  bool bVar1;
  uint uVar2;
  reference ppvVar3;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> local_48;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> local_40;
  const_iterator i;
  undefined1 local_30 [4];
  EGLint allAPIs;
  vector<void_*,_std::allocator<void_*>_> configs;
  EGLDisplay display_local;
  Library *egl_local;
  
  configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)display;
  getConfigs((vector<void_*,_std::allocator<void_*>_> *)local_30,egl,display);
  i._M_current._4_4_ = 0;
  local_40._M_current =
       (void **)std::vector<void_*,_std::allocator<void_*>_>::begin
                          ((vector<void_*,_std::allocator<void_*>_> *)local_30);
  while( true ) {
    local_48._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::end
                            ((vector<void_*,_std::allocator<void_*>_> *)local_30);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
    display_00 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    uVar2 = i._M_current._4_4_;
    if (!bVar1) break;
    ppvVar3 = __gnu_cxx::
              __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
              operator*(&local_40);
    uVar2 = getConfigAttribInt(egl,display_00,*ppvVar3,0x3040);
    i._M_current._4_4_ = uVar2 | i._M_current._4_4_;
    __gnu_cxx::__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
    operator++(&local_40);
  }
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_30);
  return uVar2;
}

Assistant:

EGLint getRenderableAPIsMask (const eglw::Library& egl, eglw::EGLDisplay display)
{
	const vector<EGLConfig>	configs	= getConfigs(egl, display);
	EGLint					allAPIs	= 0;

	for (vector<EGLConfig>::const_iterator i = configs.begin(); i != configs.end(); ++i)
		allAPIs |= getConfigAttribInt(egl, display, *i, EGL_RENDERABLE_TYPE);

	return allAPIs;
}